

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>
::process_event<afsm::test::events::string_literal>
          (states_tuple *states,size_t current_state,string_literal *event)

{
  event_process_result eVar1;
  logic_error *this;
  invocation_table<afsm::test::events::string_literal> *piVar2;
  reference this_00;
  indexes_tuple<0UL,_1UL,_2UL,_3UL> local_b1;
  undefined1 local_b0 [8];
  invocation_table<afsm::test::events::string_literal> inv_table;
  string_literal *event_local;
  size_t current_state_local;
  states_tuple *states_local;
  
  if (3 < current_state) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid current state index");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  piVar2 = inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::start,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::json_parser_def::context::end,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
           ::state_table<afsm::test::events::string_literal,0ul,1ul,2ul,3ul>(&local_b1);
  std::
  array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_4UL>
  ::array((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_4UL>
           *)local_b0,piVar2);
  this_00 = std::
            array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_4UL>
            ::operator[]((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_4UL>
                          *)local_b0,current_state);
  eVar1 = std::
          function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>
          ::operator()(this_00,states,event);
  std::
  array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_4UL>
  ::~array((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::start,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::json_parser_def::context::end,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_4UL>
            *)local_b0);
  return eVar1;
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }